

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::clara::TextFlow::Column::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  Column *pCVar1;
  string local_38;
  
  pCVar1 = this->m_column;
  if ((ulong)((long)(pCVar1->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar1->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= this->m_stringIndex) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O1/tests/catch2/catch.hpp"
                  ,0x2184,"std::string Catch::clara::TextFlow::Column::iterator::operator*() const")
    ;
  }
  if (this->m_pos <= this->m_end) {
    ::std::__cxx11::string::substr
              ((ulong)&local_38,
               (ulong)((pCVar1->m_strings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + this->m_stringIndex));
    addIndentAndSuffix(__return_storage_ptr__,this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("m_pos <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O1/tests/catch2/catch.hpp"
                ,0x2185,"std::string Catch::clara::TextFlow::Column::iterator::operator*() const");
}

Assistant:

auto operator *() const -> std::string {
			assert(m_stringIndex < m_column.m_strings.size());
			assert(m_pos <= m_end);
			return addIndentAndSuffix(line().substr(m_pos, m_len));
		}